

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

void If_LibBoxAdd(If_LibBox_t *p,If_Box_t *pBox)

{
  long lVar1;
  void **ppvVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Ptr_t *p_00;
  
  iVar6 = pBox->Id;
  p_00 = p->vBoxes;
  iVar5 = p_00->nSize;
  if (iVar5 <= iVar6) {
    lVar1 = (long)iVar6 * 2 + 10;
    iVar7 = (int)lVar1;
    if (iVar5 < iVar7) {
      iVar6 = p_00->nCap;
      iVar8 = iVar7;
      if (((iVar6 * 2 < iVar7) || (iVar8 = iVar6 * 2, iVar6 < iVar7)) && (iVar6 < iVar8)) {
        if (p_00->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc((long)iVar8 << 3);
        }
        else {
          ppvVar2 = (void **)realloc(p_00->pArray,(long)iVar8 << 3);
          iVar5 = p_00->nSize;
        }
        p_00->pArray = ppvVar2;
        p_00->nCap = iVar8;
      }
      for (lVar3 = (long)iVar5; lVar3 < lVar1; lVar3 = lVar3 + 1) {
        p_00->pArray[lVar3] = (void *)0x0;
      }
      p_00->nSize = iVar7;
      p_00 = p->vBoxes;
      iVar6 = pBox->Id;
    }
  }
  pvVar4 = Vec_PtrEntry(p_00,iVar6);
  if (pvVar4 == (void *)0x0) {
    iVar6 = pBox->Id;
    if ((-1 < (long)iVar6) && (iVar6 < p->vBoxes->nSize)) {
      p->vBoxes->pArray[iVar6] = pBox;
      p->nBoxes = p->nBoxes + 1;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  __assert_fail("Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                ,0x8c,"void If_LibBoxAdd(If_LibBox_t *, If_Box_t *)");
}

Assistant:

void If_LibBoxAdd( If_LibBox_t * p, If_Box_t * pBox )
{
    if ( pBox->Id >= Vec_PtrSize(p->vBoxes) )
        Vec_PtrFillExtra( p->vBoxes, 2 * pBox->Id + 10, NULL );
    assert( Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL );
    Vec_PtrWriteEntry( p->vBoxes, pBox->Id, pBox );
    p->nBoxes++;
}